

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int checkRef(IntegrityCk *pCheck,Pgno iPage)

{
  int iVar1;
  uint in_ESI;
  IntegrityCk *in_RDI;
  int local_4;
  
  if ((in_RDI->nCkPage < in_ESI) || (in_ESI == 0)) {
    checkAppendMsg(in_RDI,"invalid page number %u",(ulong)in_ESI);
    local_4 = 1;
  }
  else {
    iVar1 = getPageReferenced(in_RDI,in_ESI);
    if (iVar1 == 0) {
      setPageReferenced(in_RDI,in_ESI);
      local_4 = 0;
    }
    else {
      checkAppendMsg(in_RDI,"2nd reference to page %u",(ulong)in_ESI);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int checkRef(IntegrityCk *pCheck, Pgno iPage){
  if( iPage>pCheck->nCkPage || iPage==0 ){
    checkAppendMsg(pCheck, "invalid page number %u", iPage);
    return 1;
  }
  if( getPageReferenced(pCheck, iPage) ){
    checkAppendMsg(pCheck, "2nd reference to page %u", iPage);
    return 1;
  }
  setPageReferenced(pCheck, iPage);
  return 0;
}